

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::reserve
          (vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *this,size_t n)

{
  memory_resource *pmVar1;
  Half *pHVar2;
  ulong uVar3;
  int iVar4;
  undefined4 extraout_var;
  int i;
  ulong uVar5;
  
  if (this->nAlloc < n) {
    pmVar1 = (this->alloc).memoryResource;
    iVar4 = (*pmVar1->_vptr_memory_resource[2])(pmVar1,n * 2,2);
    pHVar2 = this->ptr;
    uVar3 = this->nStored;
    for (uVar5 = 0; uVar5 < uVar3; uVar5 = uVar5 + 1) {
      ((Half *)CONCAT44(extraout_var,iVar4))[uVar5].h = pHVar2[uVar5].h;
    }
    pmVar1 = (this->alloc).memoryResource;
    (*pmVar1->_vptr_memory_resource[3])(pmVar1,pHVar2,this->nAlloc * 2,2);
    this->nAlloc = n;
    this->ptr = (Half *)CONCAT44(extraout_var,iVar4);
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }